

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

string * __thiscall
httplib::to_string_abi_cxx11_(string *__return_storage_ptr__,httplib *this,Error error)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Success (no error)";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Unknown";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Could not establish connection";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Failed to bind IP address";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Failed to read connection";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Failed to write connection";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Maximum redirect count exceeded";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Connection handling canceled";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "SSL connection failed";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "SSL certificate loading failed";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "SSL server verification failed";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Unsupported HTTP multipart boundary characters";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Compression failed";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Connection timed out";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Invalid";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const Error error) {
  switch (error) {
  case Error::Success: return "Success (no error)";
  case Error::Connection: return "Could not establish connection";
  case Error::BindIPAddress: return "Failed to bind IP address";
  case Error::Read: return "Failed to read connection";
  case Error::Write: return "Failed to write connection";
  case Error::ExceedRedirectCount: return "Maximum redirect count exceeded";
  case Error::Canceled: return "Connection handling canceled";
  case Error::SSLConnection: return "SSL connection failed";
  case Error::SSLLoadingCerts: return "SSL certificate loading failed";
  case Error::SSLServerVerification: return "SSL server verification failed";
  case Error::UnsupportedMultipartBoundaryChars:
    return "Unsupported HTTP multipart boundary characters";
  case Error::Compression: return "Compression failed";
  case Error::ConnectionTimeout: return "Connection timed out";
  case Error::Unknown: return "Unknown";
  default: break;
  }

  return "Invalid";
}